

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,Geometry *g)

{
  ostream *poVar1;
  IntVect local_1c;
  
  poVar1 = operator<<(os,&g->super_CoordSys);
  poVar1 = operator<<(poVar1,&g->prob_domain);
  poVar1 = operator<<(poVar1,&g->domain);
  poVar1 = std::operator<<(poVar1,'P');
  local_1c.vect[0] = (int)(byte)(g->super_CoordSys).field_0x51;
  local_1c.vect[1] = (int)(byte)(g->super_CoordSys).field_0x52;
  local_1c.vect[2] = (int)(byte)(g->super_CoordSys).field_0x53;
  operator<<(poVar1,&local_1c);
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream&   os,
            const Geometry& g)
{
    os << (CoordSys&) g << g.ProbDomain() << g.Domain() << 'P' << IntVect(g.isPeriodic());
    return os;
}